

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorts.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  result_type_conflict rVar2;
  unsigned_long __b;
  size_type sVar3;
  ostream *poVar4;
  reference pEVar5;
  result_type rVar6;
  rep rVar7;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1498;
  duration<double,_std::ratio<1L,_1L>_> local_1490;
  rep_conflict local_1488;
  Edge *local_1478;
  Edge *local_1470;
  rep_conflict local_1468;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1460;
  duration<double,_std::ratio<1L,_1L>_> local_1458;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1450;
  time_point end;
  time_point start;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> v2;
  Edge *i_1;
  iterator __end2;
  iterator __begin2;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *__range2;
  Edge local_1400;
  undefined1 local_13e0 [8];
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> v1;
  uint64_t i;
  uniform_int_distribution<unsigned_long> uniform_dist;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13a0;
  default_random_engine e1;
  random_device r;
  
  std::random_device::random_device((random_device *)&e1);
  rVar2 = std::random_device::operator()((random_device *)&e1);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_13a0,(ulong)rVar2);
  __b = std::numeric_limits<unsigned_long>::max();
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&i,0,__b);
  v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1;
  while( true ) {
    if ((pointer)0x2710 <
        v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::random_device::~random_device((random_device *)&e1);
      return 0;
    }
    sVar3 = (long)v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage * 10000;
    Graph::Edge::Edge(&local_1400,0,0,false,0);
    std::allocator<Graph::Edge>::allocator((allocator<Graph::Edge> *)((long)&__range2 + 7));
    std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
              ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_13e0,sVar3,&local_1400,
               (allocator<Graph::Edge> *)((long)&__range2 + 7));
    std::allocator<Graph::Edge>::~allocator((allocator<Graph::Edge> *)((long)&__range2 + 7));
    sVar3 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::size
                      ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_13e0);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __end2 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::begin
                       ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_13e0);
    i_1 = (Edge *)std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::end
                            ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_13e0);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                                  *)&i_1);
      if (!bVar1) break;
      pEVar5 = __gnu_cxx::
               __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
               ::operator*(&__end2);
      rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&i,&local_13a0);
      pEVar5->shift = rVar6;
      __gnu_cxx::
      __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>::
      operator++(&__end2);
    }
    std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
              ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&start,
               (vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_13e0);
    end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    srs::radixSort((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_13e0);
    local_1450.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    poVar4 = std::operator<<((ostream *)&std::cout,"Radix sort: ");
    local_1460.__r = (rep_conflict)std::chrono::operator-(&local_1450,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_1458,&local_1460);
    rVar7 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_1458);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar7);
    poVar4 = std::operator<<(poVar4," sec.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1468 = std::chrono::_V2::system_clock::now();
    end.__d.__r = (duration)(duration)local_1468;
    local_1470 = (Edge *)std::begin<std::vector<Graph::Edge,std::allocator<Graph::Edge>>>
                                   ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&start);
    local_1478 = (Edge *)std::end<std::vector<Graph::Edge,std::allocator<Graph::Edge>>>
                                   ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&start);
    std::
    sort<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,main::__0>
              (local_1470,local_1478);
    local_1488 = std::chrono::_V2::system_clock::now();
    local_1450.__d.__r = (duration)(duration)local_1488;
    poVar4 = std::operator<<((ostream *)&std::cout,"std::sort: ");
    local_1498.__r = (rep_conflict)std::chrono::operator-(&local_1450,&end);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_1490,&local_1498);
    rVar7 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_1490);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar7);
    poVar4 = std::operator<<(poVar4," sec.");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    bVar1 = std::operator==((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_13e0,
                            (vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&start);
    if (!bVar1) break;
    std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::~vector
              ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&start);
    std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::~vector
              ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_13e0);
    v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage =
         (pointer)((long)v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage * 10);
  }
  __assert_fail("v1 == v2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rogday[P]SRS/src/tests/sorts.cpp"
                ,0x2c,"int main()");
}

Assistant:

int main() {
    std::random_device r;
    std::default_random_engine e1(r());
    std::uniform_int_distribution<srs::u64> uniform_dist(
        0, std::numeric_limits<srs::u64>::max());

    for (std::uint64_t i = 1; i <= 10'000; i *= 10) {
        std::vector<Graph::Edge> v1(10'000 * i, Graph::Edge(0, 0, false, 0));

        std::cout << v1.size() << std::endl;
        for (auto &i : v1)
            i.shift = uniform_dist(e1);
        std::vector v2(v1);

        auto start = std::chrono::system_clock::now();
        srs::radixSort(v1);
        auto end = std::chrono::system_clock::now();

        std::cout << "Radix sort: "
                  << std::chrono::duration<double>(end - start).count()
                  << " sec." << std::endl;

        start = std::chrono::system_clock::now();
        std::sort(std::begin(v2), std::end(v2),
                  [](const Graph::Edge &e1, const Graph::Edge &e2) {
                      return e1.shift < e2.shift;
                  });
        end = std::chrono::system_clock::now();

        std::cout << "std::sort: "
                  << std::chrono::duration<double>(end - start).count()
                  << " sec." << std::endl
                  << std::endl;

        assert(v1 == v2);
    }
}